

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_expression_list(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  int n_args;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<expression_list>");
  std::endl<char,std::char_traits<char>>(poVar2);
  parse_expression(this);
  n_args = 1;
  while( true ) {
    bVar1 = std::operator==(&this->cur_token,",");
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>,</symbol>");
    std::endl<char,std::char_traits<char>>(poVar2);
    query_tokenizer(this);
    parse_expression(this);
    n_args = n_args + 1;
  }
  Symbol_Table::set_temp_arg_count(&this->symbol_table,n_args);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,")",&local_69);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"identifier",&local_6a);
  check_expected_x_after_y(this,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t</expression_list>");
  std::endl<char,std::char_traits<char>>(poVar2);
  query_tokenizer(this);
  return;
}

Assistant:

void Parser::parse_expression_list() {
    out_file << "\t\t\t\t\t<expression_list>" << std::endl;
    // for recording arg counts of
    int arg_count = 0;
    parse_expression();
    arg_count++;

    while (cur_token == ",") {
        out_file << "\t\t\t\t\t<symbol>,</symbol>" << std::endl;
        query_tokenizer();

        parse_expression();
        arg_count++;
    }
    symbol_table.set_temp_arg_count(arg_count);
    check_expected_x_after_y(")", "identifier");
    out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
    out_file << "\t\t\t\t</expression_list>" << std::endl;
    query_tokenizer();
}